

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafika2.cpp
# Opt level: O2

void * inc_x(void *x_void_ptr)

{
  uint uVar1;
  int iVar2;
  
LAB_00101681:
  do {
    while( true ) {
      while( true ) {
        uVar1 = getch();
        if (uVar1 == 0xfffffffc) goto LAB_001016cb;
        if (uVar1 == 0xfffffffd) goto LAB_001016e0;
        if ((uVar1 != 0xffffffff) && (uVar1 != 0x71)) break;
        if (0 < tembakanx) {
          tembakanx = tembakanx + -10;
        }
      }
      if (uVar1 != 0x41) break;
LAB_001016cb:
      if (0 < targetx) {
        targetx = targetx + -10;
      }
    }
    if (uVar1 != 0x44) {
      if (uVar1 == 0x61) goto LAB_001016cb;
      if (uVar1 == 100) goto LAB_001016e0;
      if (uVar1 == 0x1b) {
        iVar2 = getch();
        if (iVar2 == 0x5b) {
          getch();
        }
        else if (iVar2 == 0x1b) {
          return (void *)0x0;
        }
      }
      else if (tembakanx < 0x556 && (uVar1 == 0xfffffffe || (uVar1 & 0xffffffdf) == 0x45)) {
        tembakanx = tembakanx + 10;
      }
      goto LAB_00101681;
    }
LAB_001016e0:
    if (targetx < 0x556) {
      targetx = targetx + 10;
    }
  } while( true );
}

Assistant:

void *inc_x(void *x_void_ptr)
{    
  int cmd = ' ';
  while(true){
   cmd = getch();
    if (cmd == 27) {
       cmd = getch();
       if (cmd == 27) {
         break;
       }
       else if (cmd == 91) {
         cmd = getch();
         cmd = 64 - cmd;
       }
     }
     else if (cmd == 'a' || cmd == 'A' || cmd == -4) {
       if(targetx>0)
       targetx-=10;
     }
     else if (cmd == 'd' || cmd == 'D' || cmd == -3) {
       if(targetx<1366)
       targetx+=10;
     }
     else if (cmd == 'q' || cmd == 'q' || cmd == -1) {
       if(tembakanx>0)
       tembakanx-=10;
     }
     else if (cmd == 'e' || cmd == 'E' || cmd == -2) {
       if(tembakanx<1366)
       tembakanx+=10;
     }

  }
  /* the function must return something - NULL will do */
  return NULL;

}